

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

bool __thiscall URI::parseString(URI *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [39];
  bool local_49;
  string local_48 [7];
  bool hasAuth;
  size_type local_28;
  size_type off;
  size_type start;
  URI *this_local;
  
  this->mModified = false;
  this->mRelative = false;
  off = 0;
  start = (size_type)this;
  local_28 = std::__cxx11::string::find((char *)&this->mFullString,0x13b2ae);
  if (local_28 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)&this->mFullString);
    std::__cxx11::string::operator=((string *)&this->mScheme,local_48);
    std::__cxx11::string::~string(local_48);
    local_28 = local_28 + 1;
    off = local_28;
  }
  local_49 = false;
  sVar2 = std::__cxx11::string::find((char *)&this->mFullString,0x13bdd2);
  if (sVar2 == off) {
    local_49 = true;
    off = off + 2;
  }
  else {
    sVar2 = std::__cxx11::string::find((char *)&this->mFullString,0x13bdd3);
    if (sVar2 != off) {
      uVar3 = std::__cxx11::string::empty();
      local_49 = (uVar3 & 1) != 0;
      if (local_49) {
        this->mRelative = true;
      }
      local_49 = !local_49;
    }
  }
  if ((local_49 & 1U) != 0) {
    local_28 = std::__cxx11::string::find((char *)&this->mFullString,0x13bdd3);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&this->mFullString);
    std::__cxx11::string::operator=((string *)&this->mAuthority,local_70);
    std::__cxx11::string::~string(local_70);
    off = local_28;
  }
  sVar2 = off;
  uVar3 = std::__cxx11::string::size();
  if (sVar2 < uVar3) {
    local_28 = std::__cxx11::string::find((char *)&this->mFullString,0x139fa5);
    std::__cxx11::string::substr((ulong)local_90,(ulong)&this->mFullString);
    std::__cxx11::string::operator=((string *)&this->mPath,local_90);
    std::__cxx11::string::~string(local_90);
    if (local_28 != -1) {
      off = local_28 + 1;
      local_28 = std::__cxx11::string::find((char *)&this->mFullString,0x13bdd5);
      std::__cxx11::string::substr((ulong)local_b0,(ulong)&this->mFullString);
      std::__cxx11::string::operator=((string *)&this->mQueryString,local_b0);
      std::__cxx11::string::~string(local_b0);
      bVar1 = parseQuery(this);
      if (!bVar1) {
        return false;
      }
      if (local_28 != -1) {
        std::__cxx11::string::substr((ulong)local_d0,(ulong)&this->mFullString);
        std::__cxx11::string::operator=((string *)&this->mFragment,local_d0);
        std::__cxx11::string::~string(local_d0);
      }
    }
  }
  return true;
}

Assistant:

bool URI::parseString()
{
	mModified = false;
	mRelative = false;
	
	string::size_type start = 0;
	string::size_type off = mFullString.find( ":" );
	
	if ( off != string::npos )
	{
		mScheme = mFullString.substr( 0, off );
		LOG_NOISE( "scheme is %s", mScheme.c_str() );
		off++;
		start = off;
	}
	
	bool hasAuth = false;

	// if the next chars are // or if they are not a / and we have a scheme
	//  then parse auth, otherwise if no / is found and we don't have a schem 
	//  this is a relative URI. 
	if ( mFullString.find( "//", start ) == start ) 
	{
		hasAuth = true;
		start += 2;
	}
	else if ( mFullString.find( "/", start ) != start )
	{
		if ( mScheme.empty() )
		{
			mRelative = true;
			hasAuth = false;
		}
		else
		{
			hasAuth = true;
		}
	}		
	
	if ( hasAuth )
	{
		off = mFullString.find( "/", start );

		mAuthority = mFullString.substr( start, off - start );
		LOG_NOISE( "auth is %s", mAuthority.c_str() );

		start = off;
	}
		
	if ( start < mFullString.size() )
	{
		off = mFullString.find( "?", start );
		
		mPath = mFullString.substr( start, off - start );
		
		LOG_NOISE( "path is %s", mPath.c_str() );
		
		if ( off != string::npos )
		{
			start = off + 1;
			off = mFullString.find( "#", start );
			
			mQueryString = mFullString.substr( start, off - start );
			LOG_NOISE( "query is %s", mQueryString.c_str() );
			
			if ( parseQuery() == false )
				return false;
			
			if ( off != string::npos )
			{				
				mFragment = mFullString.substr( off + 1 );
				LOG_NOISE( "fragment is %s", mFragment.c_str() );
			}
		}
	}

	return true;
}